

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.hpp
# Opt level: O0

void __thiscall cpptrace::system_error::~system_error(system_error *this)

{
  system_error *this_local;
  
  ~system_error(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

class CPPTRACE_EXPORT system_error : public runtime_error {
        std::error_code ec;
    public:
        explicit system_error(
            int error_code,
            std::string&& message_arg,
            raw_trace&& trace = detail::get_raw_trace_and_absorb()
        ) noexcept;
        const std::error_code& code() const noexcept;
    }